

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

void __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::S2ShapeIndexRegion
          (S2ShapeIndexRegion<S2ShapeIndex> *this,S2ShapeIndex *index)

{
  Iterator *pIVar1;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_00305830;
  (this->contains_query_).index_ = index;
  (this->contains_query_).options_.vertex_model_ = SEMI_OPEN;
  pIVar1 = &(this->contains_query_).it_;
  (*index->_vptr_S2ShapeIndex[6])(pIVar1,index,2);
  this->iter_ = pIVar1;
  return;
}

Assistant:

S2ShapeIndexRegion<IndexType>::S2ShapeIndexRegion(const IndexType* index)
    : contains_query_(index) {
}